

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_connect(Curl_easy *data,_Bool *done)

{
  connectdata *conn_00;
  _Bool _Var1;
  CURLcode CVar2;
  connectdata *conn;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  Curl_conncontrol(conn_00,0);
  data_local._4_4_ = Curl_proxy_connect(data,0);
  if (data_local._4_4_ == CURLE_OK) {
    if ((*(uint *)&(conn_00->bits).field_0x4 >> 4 & 1) == 0) {
      if (((conn_00->http_proxy).proxytype == '\x02') &&
         (((conn_00->bits).proxy_ssl_connected[0] & 1U) == 0)) {
        data_local._4_4_ = CURLE_OK;
      }
      else {
        _Var1 = Curl_connect_ongoing(conn_00);
        if (_Var1) {
          data_local._4_4_ = CURLE_OK;
        }
        else if (((*(ulong *)&(data->set).field_0x8e2 >> 0x2e & 1) == 0) ||
                (data_local._4_4_ = add_haproxy_protocol_header(data), data_local._4_4_ == CURLE_OK)
                ) {
          if ((conn_00->given->flags & 1) == 0) {
            *done = true;
          }
          else {
            CVar2 = https_connecting(data,done);
            if (CVar2 != CURLE_OK) {
              return CVar2;
            }
          }
          data_local._4_4_ = CURLE_OK;
        }
      }
    }
    else {
      data_local._4_4_ = CURLE_OK;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_http_connect(struct Curl_easy *data, bool *done)
{
  CURLcode result;
  struct connectdata *conn = data->conn;

  /* We default to persistent connections. We set this already in this connect
     function to make the re-use checks properly be able to check this bit. */
  connkeep(conn, "HTTP default");

#ifndef CURL_DISABLE_PROXY
  /* the CONNECT procedure might not have been completed */
  result = Curl_proxy_connect(data, FIRSTSOCKET);
  if(result)
    return result;

  if(conn->bits.proxy_connect_closed)
    /* this is not an error, just part of the connection negotiation */
    return CURLE_OK;

  if(CONNECT_FIRSTSOCKET_PROXY_SSL())
    return CURLE_OK; /* wait for HTTPS proxy SSL initialization to complete */

  if(Curl_connect_ongoing(conn))
    /* nothing else to do except wait right now - we're not done here. */
    return CURLE_OK;

  if(data->set.haproxyprotocol) {
    /* add HAProxy PROXY protocol header */
    result = add_haproxy_protocol_header(data);
    if(result)
      return result;
  }
#endif

  if(conn->given->flags & PROTOPT_SSL) {
    /* perform SSL initialization */
    result = https_connecting(data, done);
    if(result)
      return result;
  }
  else
    *done = TRUE;

  return CURLE_OK;
}